

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O2

void __thiscall gl4cts::RobustnessRobustBufferAccessBehavior::Program::Release(Program *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_id != 0) {
    Use((Functions *)CONCAT44(extraout_var,iVar1),0);
    (*((Functions *)CONCAT44(extraout_var,iVar1))->deleteProgram)(this->m_id);
    this->m_id = 0;
  }
  RobustnessRobustBufferAccessBehavior::Shader::Release(&this->m_compute);
  RobustnessRobustBufferAccessBehavior::Shader::Release(&this->m_fragment);
  RobustnessRobustBufferAccessBehavior::Shader::Release(&this->m_geometry);
  RobustnessRobustBufferAccessBehavior::Shader::Release(&this->m_tess_ctrl);
  RobustnessRobustBufferAccessBehavior::Shader::Release(&this->m_tess_eval);
  RobustnessRobustBufferAccessBehavior::Shader::Release(&this->m_vertex);
  return;
}

Assistant:

void Program::Release()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_invalid_id != m_id)
	{
		Use(gl, m_invalid_id);

		gl.deleteProgram(m_id);
		m_id = m_invalid_id;
	}

	m_compute.Release();
	m_fragment.Release();
	m_geometry.Release();
	m_tess_ctrl.Release();
	m_tess_eval.Release();
	m_vertex.Release();
}